

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O1

string * __thiscall
TgBot::Api::downloadFile
          (string *__return_storage_ptr__,Api *this,string *filePath,
          vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *args)

{
  HttpClient *pHVar1;
  string url;
  string local_f0;
  Url local_d0;
  
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,"https://api.telegram.org/file/bot","");
  std::__cxx11::string::_M_append((char *)&local_f0,(ulong)(this->_token)._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&local_f0);
  std::__cxx11::string::_M_append((char *)&local_f0,(ulong)(filePath->_M_dataplus)._M_p);
  pHVar1 = this->_httpClient;
  Url::Url(&local_d0,&local_f0);
  (*pHVar1->_vptr_HttpClient[2])(__return_storage_ptr__,pHVar1,&local_d0,args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.fragment._M_dataplus._M_p != &local_d0.fragment.field_2) {
    operator_delete(local_d0.fragment._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.query._M_dataplus._M_p != &local_d0.query.field_2) {
    operator_delete(local_d0.query._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.path._M_dataplus._M_p != &local_d0.path.field_2) {
    operator_delete(local_d0.path._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.host._M_dataplus._M_p != &local_d0.host.field_2) {
    operator_delete(local_d0.host._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.protocol._M_dataplus._M_p != &local_d0.protocol.field_2) {
    operator_delete(local_d0.protocol._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string Api::downloadFile(const string& filePath, const std::vector<HttpReqArg>& args) const {
    string url = "https://api.telegram.org/file/bot";
    url += _token;
    url += "/";
    url += filePath;

    string serverResponse = _httpClient.makeRequest(url, args);

    return serverResponse;
}